

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_intersect(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  jx9_value *pValue;
  jx9_value *pNeedle;
  int local_5c;
  int local_58;
  int i;
  sxu32 n;
  sxi32 rc;
  jx9_value *pVal;
  jx9_value *pArray;
  jx9_hashmap *pMap;
  jx9_hashmap *pSrc;
  jx9_hashmap_node *pEntry;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_json_array(*apArg), iVar1 == 0)) {
    jx9_result_null(pCtx);
  }
  else if (nArg == 1) {
    jx9_result_value(pCtx,*apArg);
  }
  else {
    pValue = jx9_context_new_array(pCtx);
    if (pValue == (jx9_value *)0x0) {
      jx9_result_null(pCtx);
    }
    else {
      pSrc = *(jx9_hashmap **)(((*apArg)->x).iVal + 0x10);
      for (local_58 = *(int *)(((*apArg)->x).iVal + 0x2c); local_58 != 0; local_58 = local_58 + -1)
      {
        pNeedle = HashmapExtractNodeValue((jx9_hashmap_node *)pSrc);
        if (pNeedle != (jx9_value *)0x0) {
          local_5c = 1;
          while ((local_5c < nArg &&
                 ((iVar1 = jx9_value_is_json_array(apArg[local_5c]), iVar1 == 0 ||
                  (iVar1 = HashmapFindValue((jx9_hashmap *)(apArg[local_5c]->x).pOther,pNeedle,
                                            (jx9_hashmap_node **)0x0,1), iVar1 == 0))))) {
            local_5c = local_5c + 1;
          }
          if (nArg <= local_5c) {
            HashmapInsertNode((jx9_hashmap *)(pValue->x).pOther,(jx9_hashmap_node *)pSrc,1);
          }
        }
        pSrc = (jx9_hashmap *)pSrc->iNextIdx;
      }
      jx9_result_value(pCtx,pValue);
    }
  }
  return 0;
}

Assistant:

static int jx9_hashmap_intersect(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap_node *pEntry;
	jx9_hashmap *pSrc, *pMap;
	jx9_value *pArray;
	jx9_value *pVal;
	sxi32 rc;
	sxu32 n;
	int i;
	if( nArg < 1 || !jx9_value_is_json_array(apArg[0]) ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( nArg == 1 ){
		/* Return the first array since we cannot perform a diff */
		jx9_result_value(pCtx, apArg[0]);
		return JX9_OK;
	}
	/* Create a new array */
	pArray = jx9_context_new_array(pCtx);
	if( pArray == 0 ){
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the source hashmap */
	pSrc = (jx9_hashmap *)apArg[0]->x.pOther;
	/* Perform the intersection */
	pEntry = pSrc->pFirst;
	n = pSrc->nEntry;
	for(;;){
		if( n < 1 ){
			break;
		}
		/* Extract the node value */
		pVal = HashmapExtractNodeValue(pEntry);
		if( pVal ){
			for( i = 1 ; i < nArg ; i++ ){
				if( !jx9_value_is_json_array(apArg[i])) {
					/* ignore */
					continue;
				}
				/* Point to the internal representation of the hashmap */
				pMap = (jx9_hashmap *)apArg[i]->x.pOther;
				/* Perform the lookup */
				rc = HashmapFindValue(pMap, pVal, 0, TRUE);
				if( rc != SXRET_OK ){
					/* Value does not exist */
					break;
				}
			}
			if( i >= nArg ){
				/* Perform the insertion */
				HashmapInsertNode((jx9_hashmap *)pArray->x.pOther, pEntry, TRUE);
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
		n--;
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	return JX9_OK;
}